

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O2

void __thiscall SQArray::Pop(SQArray *this)

{
  sqvector<SQObjectPtr>::pop_back(&this->_values);
  ShrinkIfNeeded(this);
  return;
}

Assistant:

void Pop(){_values.pop_back(); ShrinkIfNeeded(); }